

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

int fits_hdecompress64(uchar *input,int smooth,LONGLONG *a,int *ny,int *nx,int *scale,int *status)

{
  LONGLONG LVar1;
  int iVar2;
  int *in_RCX;
  LONGLONG *in_RDX;
  LONGLONG *in_R8;
  int *in_R9;
  int nval;
  int ii;
  int *iarray;
  int stat;
  int in_stack_00000118;
  int in_stack_0000011c;
  int in_stack_00000120;
  int in_stack_00000124;
  LONGLONG *in_stack_00000128;
  int local_4c;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_4;
  
  if (*_nval < 1) {
    iVar2 = decode64((uchar *)in_RCX,in_R8,in_R9,
                     (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
    *_nval = iVar2;
    if (iVar2 == 0) {
      undigitize64(in_RDX,(int)*in_R8,*in_RCX,*in_R9);
      iVar2 = hinv64(in_stack_00000128,in_stack_00000124,in_stack_00000120,in_stack_0000011c,
                     in_stack_00000118);
      *_nval = iVar2;
      LVar1 = *in_R8;
      iVar2 = *in_RCX;
      for (local_4c = 0; local_4c < (int)LVar1 * iVar2; local_4c = local_4c + 1) {
        *(int *)((long)in_RDX + (long)local_4c * 4) = (int)in_RDX[local_4c];
      }
      local_4 = *_nval;
    }
    else {
      local_4 = *_nval;
    }
  }
  else {
    local_4 = *_nval;
  }
  return local_4;
}

Assistant:

int fits_hdecompress64(unsigned char *input, int smooth, LONGLONG *a, int *ny, int *nx, 
                     int *scale, int *status)
{
  /* 
     decompress the input byte stream using the H-compress algorithm
  
   input  - input array of compressed bytes
   a - pre-allocated array to hold the output uncompressed image
   nx - returned X axis size
   ny - returned Y axis size

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */
  int stat, *iarray, ii, nval;

  if (*status > 0) return(*status);

	/* decode the input array */

        FFLOCK;  /* decode uses the nextchar global variable */
	stat = decode64(input, a, nx, ny, scale);
        FFUNLOCK;

        *status = stat;
	if (stat) return(*status);
	
	/*
	 * Un-Digitize
	 */
	undigitize64(a, *nx, *ny, *scale);

	/*
	 * Inverse H-transform
	 */
	stat = hinv64(a, *nx, *ny, smooth, *scale);

        *status = stat;
	
         /* pack the I*8 values back into an I*4 array */
        iarray = (int *) a;
	nval = (*nx) * (*ny);

	for (ii = 0; ii < nval; ii++)
	   iarray[ii] = (int) a[ii];	

  return(*status);
}